

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O0

void ryg_dxt::DitherBlock(Pixel *dest,Pixel *block)

{
  long lVar1;
  long in_RSI;
  long in_RDI;
  sInt y;
  sU8 *quant;
  sU8 *dp;
  sU8 *bp;
  sInt ch;
  sInt *ep2;
  sInt *ep1;
  sInt err [8];
  sInt in_stack_ffffffffffffff88;
  sInt in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  byte *local_60;
  byte *local_58;
  int local_4c;
  int *local_48;
  int *local_40;
  int local_38 [4];
  int local_28 [6];
  long local_10;
  long local_8;
  
  local_40 = local_38;
  local_48 = local_28;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
    lVar1 = 0x293ea8;
    if (local_4c == 1) {
      lVar1 = 0x293fb8;
    }
    local_58 = (byte *)(local_10 + local_4c);
    local_60 = (byte *)(local_8 + local_4c);
    sSetMem((void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
            in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    for (in_stack_ffffffffffffff94 = 0; in_stack_ffffffffffffff94 < 4;
        in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 + 1) {
      *local_60 = *(byte *)(lVar1 + (int)((uint)*local_58 + (local_48[1] * 3 + *local_48 * 5 >> 4)))
      ;
      *local_40 = (uint)*local_58 - (uint)*local_60;
      local_60[4] = *(byte *)(lVar1 + (int)((uint)local_58[4] +
                                           (*local_40 * 7 + local_48[2] * 3 + local_48[1] * 5 +
                                            *local_48 >> 4)));
      local_40[1] = (uint)local_58[4] - (uint)local_60[4];
      local_60[8] = *(byte *)(lVar1 + (int)((uint)local_58[8] +
                                           (local_40[1] * 7 + local_48[3] * 3 + local_48[2] * 5 +
                                            local_48[1] >> 4)));
      local_40[2] = (uint)local_58[8] - (uint)local_60[8];
      local_60[0xc] =
           *(byte *)(lVar1 + (int)((uint)local_58[0xc] +
                                  (local_40[2] * 7 + local_48[3] * 5 + local_48[2] >> 4)));
      local_40[3] = (uint)local_58[0xc] - (uint)local_60[0xc];
      sSwap<int*>(&local_40,&local_48);
      local_58 = local_58 + 0x10;
      local_60 = local_60 + 0x10;
    }
  }
  return;
}

Assistant:

static void DitherBlock(Pixel* dest, const Pixel* block) {
  sInt err[8], *ep1 = err, *ep2 = err + 4;

  // process channels seperately
  for (sInt ch = 0; ch < 3; ch++) {
    sU8* bp = (sU8*)block;
    sU8* dp = (sU8*)dest;
    sU8* quant = (ch == 1) ? QuantGTab + 8 : QuantRBTab + 8;

    bp += ch;
    dp += ch;
    sSetMem(err, 0, sizeof(err));

    for (sInt y = 0; y < 4; y++) {
      // pixel 0
      dp[0] = quant[bp[0] + ((3 * ep2[1] + 5 * ep2[0]) >> 4)];
      ep1[0] = bp[0] - dp[0];

      // pixel 1
      dp[4] = quant[bp[4] + ((7 * ep1[0] + 3 * ep2[2] + 5 * ep2[1] + ep2[0]) >> 4)];
      ep1[1] = bp[4] - dp[4];

      // pixel 2
      dp[8] = quant[bp[8] + ((7 * ep1[1] + 3 * ep2[3] + 5 * ep2[2] + ep2[1]) >> 4)];
      ep1[2] = bp[8] - dp[8];

      // pixel 3
      dp[12] = quant[bp[12] + ((7 * ep1[2] + 5 * ep2[3] + ep2[2]) >> 4)];
      ep1[3] = bp[12] - dp[12];

      // advance to next line
      sSwap(ep1, ep2);
      bp += 16;
      dp += 16;
    }
  }
}